

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

fullpath_ref_t GetInputFile(char **p)

{
  fullpath_ref_t pSVar1;
  undefined1 local_38 [8];
  delim_string_t name_in;
  char **p_local;
  
  name_in._32_8_ = p;
  GetDelimitedStringEx_abi_cxx11_((delim_string_t *)local_38,p);
  pSVar1 = GetInputFile((delim_string_t *)local_38);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EDelimiterType>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EDelimiterType>
           *)local_38);
  return pSVar1;
}

Assistant:

fullpath_ref_t GetInputFile(char*& p) {
	auto name_in = GetDelimitedStringEx(p);
	return GetInputFile(std::move(name_in));
}